

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::default_cost_type<double>::
make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
          (default_cost_type<double> *this,int n,
          linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *rng)

{
  double min;
  pointer end;
  default_cost_type<double> *pdVar1;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  _Var2;
  double *pdVar3;
  int i;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  end_00;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  begin;
  pointer ppVar8;
  double dVar9;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> r;
  allocator_type local_59;
  _Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> local_58;
  size_type local_40;
  default_cost_type<double> *local_38;
  
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::vector
            ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)&local_58,
             (long)n,&local_59);
  pdVar3 = (this->linear_elements)._M_t.
           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl;
  uVar7 = (ulong)(uint)n;
  piVar4 = &(local_58._M_impl.super__Vector_impl_data._M_start)->second;
  for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    ((pair<double,_int> *)(piVar4 + -2))->first = pdVar3[uVar5];
    *piVar4 = (int)uVar5;
    piVar4 = piVar4 + 4;
  }
  local_40 = (long)n;
  local_38 = this;
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::default_cost_type<double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
            (local_58._M_impl.super__Vector_impl_data._M_start,
             local_58._M_impl.super__Vector_impl_data._M_finish);
  end = local_58._M_impl.super__Vector_impl_data._M_finish;
  begin._M_current = local_58._M_impl.super__Vector_impl_data._M_start;
  ppVar8 = local_58._M_impl.super__Vector_impl_data._M_start;
  for (end_00._M_current = local_58._M_impl.super__Vector_impl_data._M_start;
      end_00._M_current != end; end_00._M_current = end_00._M_current + 1) {
    dVar9 = (end_00._M_current)->first;
    min = (begin._M_current)->first;
    if (((dVar9 != min) || (_Var2._M_current = begin._M_current, NAN(dVar9) || NAN(min))) &&
       (_Var2._M_current = end_00._M_current, 0x10 < (long)ppVar8 - (long)begin._M_current)) {
      random_epsilon_unique<double,__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>
                (begin,end_00,rng,min,dVar9);
    }
    ppVar8 = ppVar8 + 1;
    begin._M_current = _Var2._M_current;
  }
  if (0x10 < (long)end - (long)begin._M_current) {
    if ((long)begin._M_current - (long)local_58._M_impl.super__Vector_impl_data._M_start == 0) {
      random_epsilon_unique<double,__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>
                (begin,(__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                        )end,rng,(begin._M_current)->first,(begin._M_current)->first + 1.0);
    }
    else {
      dVar9 = linearize<long,double>
                        (0,(local_58._M_impl.super__Vector_impl_data._M_start)->first,
                         (long)begin._M_current -
                         (long)local_58._M_impl.super__Vector_impl_data._M_start >> 4,
                         (begin._M_current)->first,
                         (long)local_58._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_58._M_impl.super__Vector_impl_data._M_start >> 4);
      random_epsilon_unique<double,__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>
                (begin,(__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                        )end,rng,(begin._M_current)->first,dVar9);
    }
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::default_cost_type<double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
            (local_58._M_impl.super__Vector_impl_data._M_start,
             local_58._M_impl.super__Vector_impl_data._M_finish);
  pdVar1 = local_38;
  pdVar3 = (local_38->linear_elements)._M_t.
           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl;
  for (lVar6 = 0; uVar7 * 8 - lVar6 != 0; lVar6 = lVar6 + 8) {
    *(undefined8 *)((long)pdVar3 + lVar6) =
         *(undefined8 *)
          ((long)&(local_58._M_impl.super__Vector_impl_data._M_start)->first + lVar6 * 2);
  }
  pdVar3 = std::__max_element<double*,__gnu_cxx::__ops::_Iter_less_iter>(pdVar3,pdVar3 + local_40);
  dVar9 = *pdVar3;
  if ((uint)((ulong)((long)ABS(dVar9) + -0x10000000000000) >> 0x35) < 0x3ff) {
    pdVar3 = (pdVar1->linear_elements)._M_t.
             super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl;
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      pdVar3[uVar5] = pdVar3[uVar5] / dVar9;
    }
  }
  std::_Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::~_Vector_base
            (&local_58);
  return;
}

Assistant:

void make_random_norm(int n, Random& rng)
    {
        std::vector<std::pair<Float, int>> r(n);

        for (int i = 0; i != n; ++i)
            r[i] = { linear_elements[i], i };

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.first < rhs.first;
        });

        auto begin = r.begin();
        auto end = r.end();
        auto next = r.begin()++;
        for (; next != end; ++next) {
            if (next->first != begin->first) {
                if (std::distance(begin, next) > 1)
                    random_epsilon_unique(
                      begin, next, rng, begin->first, next->first);

                begin = next;
            }
        }

        if (std::distance(begin, end) > 1) {
            if (begin == r.begin()) {
                random_epsilon_unique(
                  begin, end, rng, begin->first, begin->first + 1);
            } else {
                auto value = linearize(std::ptrdiff_t(0),
                                       r.front().first,
                                       std::distance(r.begin(), begin),
                                       begin->first,
                                       std::distance(r.begin(), r.end()));

                random_epsilon_unique(begin, end, rng, begin->first, value);
            }
        }

        // Reorder the vector according to the variable index, so, it
        // restores the initial order.

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.second < rhs.second;
        });

        for (int i = 0; i != n; ++i)
            linear_elements[i] = r[i].first;

        // Finally we compute the l+oo norm.

        Float div =
          *std::max_element(linear_elements.get(), linear_elements.get() + n);
        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }